

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::rc::Texture2DArray::sample4
          (Texture2DArray *this,Vec4 *output,Vec3 *packetTexcoords,float lodBias)

{
  Vec3 *pVVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float r;
  float *local_a8;
  float *local_a0;
  undefined1 local_90 [24];
  float lod;
  float p;
  float mv;
  float mu;
  Vec3 *dFdy;
  Vec3 *dFdx;
  int fragNdx;
  Vec3 dFdy1;
  Vec3 dFdy0;
  Vec3 dFdx1;
  Vec3 dFdx0;
  float texHeight;
  float texWidth;
  float lodBias_local;
  Vec3 *packetTexcoords_local;
  Vec4 *output_local;
  Texture2DArray *this_local;
  
  iVar2 = tcu::Texture2DArrayView::getWidth(&this->m_view);
  iVar3 = tcu::Texture2DArrayView::getHeight(&this->m_view);
  tcu::operator-((tcu *)(dFdx1.m_data + 1),packetTexcoords + 1,packetTexcoords);
  tcu::operator-((tcu *)(dFdy0.m_data + 1),packetTexcoords + 3,packetTexcoords + 2);
  tcu::operator-((tcu *)(dFdy1.m_data + 1),packetTexcoords + 2,packetTexcoords);
  tcu::operator-((tcu *)((long)&dFdx + 4),packetTexcoords + 3,packetTexcoords + 1);
  for (dFdx._0_4_ = 0; (int)(uint)dFdx < 4; dFdx._0_4_ = (uint)dFdx + 1) {
    if (((uint)dFdx & 2) == 0) {
      pVVar1 = &dFdx1;
    }
    else {
      pVVar1 = &dFdy0;
    }
    local_a0 = pVVar1->m_data + 1;
    dFdy = (Vec3 *)local_a0;
    if (((uint)dFdx & 1) == 0) {
      pVVar1 = &dFdy1;
    }
    else {
      pVVar1 = (Vec3 *)&dFdx;
    }
    local_a8 = pVVar1->m_data + 1;
    _mv = local_a8;
    fVar4 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_a0);
    fVar4 = de::abs<float>(fVar4);
    fVar5 = tcu::Vector<float,_3>::x((Vector<float,_3> *)_mv);
    fVar5 = de::abs<float>(fVar5);
    p = de::max<float>(fVar4,fVar5);
    fVar4 = tcu::Vector<float,_3>::y(dFdy);
    fVar4 = de::abs<float>(fVar4);
    fVar5 = tcu::Vector<float,_3>::y((Vector<float,_3> *)_mv);
    fVar5 = de::abs<float>(fVar5);
    lod = de::max<float>(fVar4,fVar5);
    local_90._20_4_ = de::max<float>(p * (float)iVar2,lod * (float)iVar3);
    local_90._16_4_ = deFloatLog2((float)local_90._20_4_);
    local_90._16_4_ = (float)local_90._16_4_ + lodBias;
    fVar4 = tcu::Vector<float,_3>::x(packetTexcoords + (int)(uint)dFdx);
    fVar5 = tcu::Vector<float,_3>::y(packetTexcoords + (int)(uint)dFdx);
    r = tcu::Vector<float,_3>::z(packetTexcoords + (int)(uint)dFdx);
    sample((Texture2DArray *)local_90,fVar4,fVar5,r,(float)local_90._16_4_);
    *(undefined8 *)output[(int)(uint)dFdx].m_data = local_90._0_8_;
    *(undefined8 *)(output[(int)(uint)dFdx].m_data + 2) = local_90._8_8_;
  }
  return;
}

Assistant:

void Texture2DArray::sample4 (tcu::Vec4 output[4], const tcu::Vec3 packetTexcoords[4], float lodBias) const
{
	const float texWidth  = (float)m_view.getWidth();
	const float texHeight = (float)m_view.getHeight();

	const tcu::Vec3 dFdx0 = packetTexcoords[1] - packetTexcoords[0];
	const tcu::Vec3 dFdx1 = packetTexcoords[3] - packetTexcoords[2];
	const tcu::Vec3 dFdy0 = packetTexcoords[2] - packetTexcoords[0];
	const tcu::Vec3 dFdy1 = packetTexcoords[3] - packetTexcoords[1];

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec3& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec3& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * texWidth, mv * texHeight);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), lod);
	}
}